

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

int ZSTDMT_overlapLog_default(ZSTD_strategy strat)

{
  if (strat - ZSTD_lazy2 < 5) {
    return *(int *)(&DAT_0017fccc + (ulong)(strat - ZSTD_lazy2) * 4);
  }
  return 6;
}

Assistant:

static int ZSTDMT_overlapLog_default(ZSTD_strategy strat)
{
    switch(strat)
    {
        case ZSTD_btultra2:
            return 9;
        case ZSTD_btultra:
        case ZSTD_btopt:
            return 8;
        case ZSTD_btlazy2:
        case ZSTD_lazy2:
            return 7;
        case ZSTD_lazy:
        case ZSTD_greedy:
        case ZSTD_dfast:
        case ZSTD_fast:
        default:;
    }
    return 6;
}